

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

Am_Wrapper * popup_sub_win_undo_handler_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  undefined1 local_48 [8];
  Am_Value v;
  Am_Object undo_handler;
  Am_Object local_20;
  Am_Object main_window;
  Am_Object for_item;
  Am_Object *self_local;
  
  Am_Object::Am_Object(&main_window);
  Am_Object::Am_Object(&local_20);
  Am_Object::Am_Object((Am_Object *)&v.value);
  pAVar2 = Am_Object::Get(self,0x1d3,0);
  Am_Object::operator=(&main_window,pAVar2);
  bVar1 = Am_Object::Valid(&main_window);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_48);
    pAVar2 = Am_Object::Peek(&main_window,0x68,0);
    Am_Value::operator=((Am_Value *)local_48,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)local_48);
    if (bVar1) {
      Am_Object::operator=(&local_20,(Am_Value *)local_48);
      bVar1 = Am_Object::Valid(&local_20);
      if (bVar1) {
        pAVar2 = Am_Object::Peek(&local_20,0x174,0);
        Am_Value::operator=((Am_Value *)local_48,pAVar2);
        bVar1 = Am_Value::Valid((Am_Value *)local_48);
        if (bVar1) {
          Am_Object::operator=((Am_Object *)&v.value,(Am_Value *)local_48);
        }
      }
    }
    Am_Value::~Am_Value((Am_Value *)local_48);
  }
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&v.value);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&main_window);
  return pAVar3;
}

Assistant:

Am_Define_Object_Formula(popup_sub_win_undo_handler)
{
  Am_Object for_item, main_window, undo_handler;
  for_item = self.Get(Am_FOR_ITEM);
  if (for_item.Valid()) {
    Am_Value v;
    v = for_item.Peek(Am_WINDOW);
    if (v.Valid()) {
      main_window = v;
      if (main_window.Valid()) {
        v = main_window.Peek(Am_UNDO_HANDLER);
        if (v.Valid())
          undo_handler = v;
      }
    }
  }
  return undo_handler;
}